

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

void calc_proj_params_r1_high_bd_avx2
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt1,int flt1_stride,int64_t (*H) [2],int64_t *C)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  int in_ECX;
  int iVar7;
  ulong in_RDX;
  longlong extraout_RDX;
  longlong in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  __m128i v;
  __m128i v_00;
  long in_stack_00000008;
  undefined4 in_stack_0000001c;
  __m128i c;
  __m128i c1_val;
  __m128i c1_128bit;
  __m128i h11_val;
  __m128i h11_128bit;
  __m256i c1_odd;
  __m256i c1_even;
  __m256i h11_odd;
  __m256i h11_even;
  __m256i s;
  __m256i d;
  __m256i f2;
  __m256i s_load;
  __m256i u_load;
  int j;
  int i;
  __m256i zero;
  __m256i c1;
  __m256i h11;
  uint16_t *dat;
  uint16_t *src;
  int size;
  int local_668;
  int local_664;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  
  iVar7 = (int)in_RDX;
  iVar6 = (int)in_RSI * iVar7;
  local_640 = ZEXT1632(ZEXT816(0));
  local_620 = local_640;
  for (local_664 = 0; local_664 < iVar7; local_664 = local_664 + 1) {
    for (local_668 = 0; local_668 < (int)in_RSI; local_668 = local_668 + 8) {
      auVar2 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                               (in_R8 * 2 + (long)(local_664 * in_R9D) * 2 + (long)local_668 * 2));
      auVar3 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                               (in_RDI * 2 + (long)(local_664 * in_ECX) * 2 + (long)local_668 * 2));
      in_RDX = (ulong)flt1 & 0xffffffff;
      auVar2 = vpslld_avx2(auVar2,ZEXT416(4));
      auVar3 = vpslld_avx2(auVar3,ZEXT416(4));
      auVar10 = vpsubd_avx2(auVar3,auVar2);
      auVar5 = vpsubd_avx2(*(undefined1 (*) [32])
                            (in_stack_00000008 + (long)(local_664 * (int)flt1) * 4 +
                            (long)local_668 * 4),auVar2);
      auVar2 = vpmuldq_avx2(auVar5,auVar5);
      auVar3 = vpsrlq_avx2(auVar5,ZEXT416(0x20));
      auVar4 = vpsrlq_avx2(auVar5,ZEXT416(0x20));
      auVar3 = vpmuldq_avx2(auVar3,auVar4);
      auVar2 = vpaddq_avx2(local_620,auVar2);
      local_620 = vpaddq_avx2(auVar2,auVar3);
      auVar2 = vpmuldq_avx2(auVar5,auVar10);
      auVar3 = vpsrlq_avx2(auVar5,ZEXT416(0x20));
      auVar4 = vpsrlq_avx2(auVar10,ZEXT416(0x20));
      auVar10 = vpsllq_avx2(auVar3,0x20);
      auVar10 = vpsrad_avx2(auVar10,0x1f);
      vpblendd_avx2(auVar3,auVar10,0xaa);
      auVar10 = vpsllq_avx2(auVar4,0x20);
      auVar10 = vpsrad_avx2(auVar10,0x1f);
      vpblendd_avx2(auVar4,auVar10,0xaa);
      auVar3 = vpmuldq_avx2(auVar3,auVar4);
      auVar2 = vpaddq_avx2(local_640,auVar2);
      local_640 = vpaddq_avx2(auVar2,auVar3);
    }
  }
  auVar1 = vpaddq_avx(local_620._16_16_,local_620._0_16_);
  auVar8 = vpsrldq_avx(auVar1,8);
  auVar1 = vpaddq_avx(auVar1,auVar8);
  auVar8 = vpaddq_avx(local_640._16_16_,local_640._0_16_);
  auVar9 = vpsrldq_avx(auVar8,8);
  auVar8 = vpaddq_avx(auVar8,auVar9);
  vpunpcklqdq_avx(ZEXT816(0),auVar8);
  vpunpcklqdq_avx(ZEXT816(0),auVar1);
  v[1] = in_RDX;
  v[0] = in_RSI;
  xx_storeu_128(H,v);
  v_00[1] = extraout_RDX;
  v_00[0] = in_RSI;
  xx_storeu_128((void *)(CONCAT44(in_stack_0000001c,flt1_stride) + 0x10),v_00);
  *(long *)(CONCAT44(in_stack_0000001c,flt1_stride) + 0x18) =
       *(long *)(CONCAT44(in_stack_0000001c,flt1_stride) + 0x18) / (long)iVar6;
  (*H)[1] = (*H)[1] / (long)iVar6;
  return;
}

Assistant:

static inline void calc_proj_params_r1_high_bd_avx2(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt1, int flt1_stride,
    int64_t H[2][2], int64_t C[2]) {
  const int size = width * height;
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dat = CONVERT_TO_SHORTPTR(dat8);
  __m256i h11, c1;
  const __m256i zero = _mm256_setzero_si256();
  c1 = h11 = zero;

  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; j += 8) {
      const __m256i u_load = _mm256_cvtepu16_epi32(
          _mm_load_si128((__m128i *)(dat + i * dat_stride + j)));
      const __m256i s_load = _mm256_cvtepu16_epi32(
          _mm_load_si128((__m128i *)(src + i * src_stride + j)));
      __m256i f2 = _mm256_loadu_si256((__m256i *)(flt1 + i * flt1_stride + j));
      __m256i d = _mm256_slli_epi32(u_load, SGRPROJ_RST_BITS);
      __m256i s = _mm256_slli_epi32(s_load, SGRPROJ_RST_BITS);
      s = _mm256_sub_epi32(s, d);
      f2 = _mm256_sub_epi32(f2, d);

      const __m256i h11_even = _mm256_mul_epi32(f2, f2);
      const __m256i h11_odd = _mm256_mul_epi32(_mm256_srli_epi64(f2, 32),
                                               _mm256_srli_epi64(f2, 32));
      h11 = _mm256_add_epi64(h11, h11_even);
      h11 = _mm256_add_epi64(h11, h11_odd);

      const __m256i c1_even = _mm256_mul_epi32(f2, s);
      const __m256i c1_odd =
          _mm256_mul_epi32(_mm256_srli_epi64(f2, 32), _mm256_srli_epi64(s, 32));
      c1 = _mm256_add_epi64(c1, c1_even);
      c1 = _mm256_add_epi64(c1, c1_odd);
    }
  }

  const __m128i h11_128bit = _mm_add_epi64(_mm256_extracti128_si256(h11, 1),
                                           _mm256_castsi256_si128(h11));
  const __m128i h11_val =
      _mm_add_epi64(h11_128bit, _mm_srli_si128(h11_128bit, 8));

  const __m128i c1_128bit = _mm_add_epi64(_mm256_extracti128_si256(c1, 1),
                                          _mm256_castsi256_si128(c1));
  const __m128i c1_val = _mm_add_epi64(c1_128bit, _mm_srli_si128(c1_128bit, 8));

  const __m128i c = _mm_unpacklo_epi64(_mm256_castsi256_si128(zero), c1_val);
  const __m128i h1x = _mm_unpacklo_epi64(_mm256_castsi256_si128(zero), h11_val);

  xx_storeu_128(C, c);
  xx_storeu_128(H[1], h1x);

  H[1][1] /= size;
  C[1] /= size;
}